

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

HomogeneousMedium *
pbrt::HomogeneousMedium::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  ulong uVar3;
  HomogeneousMedium *pHVar4;
  undefined8 in_RDX;
  SpectrumHandle *in_RDI;
  Float FVar5;
  Float FVar6;
  Float g;
  Float sigScale;
  SpectrumHandle Le;
  string preset;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  RGBSpectrum *in_stack_fffffffffffffcf8;
  ParameterDictionary *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffd10;
  allocator<char> *args_4;
  undefined4 in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  allocator<char> *__a;
  SpectrumHandle *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  Allocator in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  polymorphic_allocator<std::byte> *args_5;
  ParameterDictionary *in_stack_fffffffffffffd58;
  SpectrumType in_stack_fffffffffffffd6c;
  SpectrumHandle *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  Allocator in_stack_fffffffffffffd88;
  allocator<char> local_221;
  string local_220 [32];
  Float local_200;
  allocator<char> local_1f9;
  string local_1f8 [32];
  Float local_1d8;
  undefined4 local_1d4;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_1c8;
  undefined8 local_1c0;
  undefined8 local_1a9;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_188;
  RGB local_17c;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_168;
  undefined8 local_160;
  undefined1 local_149 [41];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_120;
  RGB local_114;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_100;
  undefined8 local_f8;
  allocator<char> local_e1;
  string local_e0 [40];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_b8;
  undefined8 local_b0;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_28;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_20 [2];
  SpectrumHandle *local_10;
  undefined8 local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDX;
  SpectrumHandle::TaggedPointer
            ((SpectrumHandle *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  SpectrumHandle::TaggedPointer
            ((SpectrumHandle *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
             (char *)in_stack_fffffffffffffd38,(allocator<char> *)in_stack_fffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
             (char *)in_stack_fffffffffffffd38,(allocator<char> *)in_stack_fffffffffffffd30);
  ParameterDictionary::GetOneString
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             (string *)in_stack_fffffffffffffd48.memoryResource);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_b0 = local_8;
    bVar1 = GetMediumScatteringProperties
                      ((string *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                       in_stack_fffffffffffffd38,(SpectrumHandle *)in_stack_fffffffffffffd30,
                       in_stack_fffffffffffffd48);
    if (!bVar1) {
      Warning<std::__cxx11::string&>
                ((FileLoc *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (char *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    }
  }
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  ::TaggedPointer(&local_b8,(nullptr_t)0x0);
  bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ::operator==(local_20,&local_b8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               (char *)in_stack_fffffffffffffd38,(allocator<char> *)in_stack_fffffffffffffd30);
    SpectrumHandle::TaggedPointer
              ((SpectrumHandle *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    local_f8 = local_8;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
               in_stack_fffffffffffffd88);
    SpectrumHandle::operator=
              ((SpectrumHandle *)in_stack_fffffffffffffd00,
               (SpectrumHandle *)in_stack_fffffffffffffcf8);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    ::TaggedPointer(&local_100,(nullptr_t)0x0);
    bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            ::operator==(local_20,&local_100);
    if (bVar1) {
      RGB::RGB(&local_114,0.0011,0.0024,0.014);
      in_stack_fffffffffffffd88.memoryResource =
           (memory_resource *)
           pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB>
                     (in_stack_fffffffffffffd10,
                      (RGBColorSpace *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
                      ,(RGB *)in_stack_fffffffffffffd00);
      SpectrumHandle::TaggedPointer<pbrt::RGBSpectrum>
                ((SpectrumHandle *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      SpectrumHandle::operator=
                ((SpectrumHandle *)in_stack_fffffffffffffd00,
                 (SpectrumHandle *)in_stack_fffffffffffffcf8);
    }
  }
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  ::TaggedPointer(&local_120,(nullptr_t)0x0);
  uVar2 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ::operator==(&local_28,&local_120);
  if ((bool)uVar2) {
    in_stack_fffffffffffffd78 = (string *)local_149;
    in_stack_fffffffffffffd70 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               (char *)in_stack_fffffffffffffd38,(allocator<char> *)in_stack_fffffffffffffd30);
    SpectrumHandle::TaggedPointer
              ((SpectrumHandle *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    local_160 = local_8;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)CONCAT17(uVar2,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
               in_stack_fffffffffffffd88);
    SpectrumHandle::operator=
              ((SpectrumHandle *)in_stack_fffffffffffffd00,
               (SpectrumHandle *)in_stack_fffffffffffffcf8);
    std::__cxx11::string::~string((string *)(local_149 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_149);
    TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    ::TaggedPointer(&local_168,(nullptr_t)0x0);
    bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            ::operator==(&local_28,&local_168);
    in_stack_fffffffffffffd6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd6c);
    if (bVar1) {
      RGB::RGB(&local_17c,2.55,3.21,3.77);
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB>
                (in_stack_fffffffffffffd10,
                 (RGBColorSpace *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 (RGB *)in_stack_fffffffffffffd00);
      SpectrumHandle::TaggedPointer<pbrt::RGBSpectrum>
                ((SpectrumHandle *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      SpectrumHandle::operator=
                ((SpectrumHandle *)in_stack_fffffffffffffd00,
                 (SpectrumHandle *)in_stack_fffffffffffffcf8);
    }
  }
  args_5 = (polymorphic_allocator<std::byte> *)&local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
             (char *)in_stack_fffffffffffffd38,(allocator<char> *)in_stack_fffffffffffffd30);
  SpectrumHandle::TaggedPointer
            ((SpectrumHandle *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  local_1c0 = local_8;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)CONCAT17(uVar2,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
             in_stack_fffffffffffffd88);
  std::__cxx11::string::~string((string *)((long)&local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  ::TaggedPointer(&local_1c8,(nullptr_t)0x0);
  uVar2 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ::operator==(&local_188,&local_1c8);
  if ((bool)uVar2) {
    local_1d4 = 0;
    in_stack_fffffffffffffd38 =
         (SpectrumHandle *)
         pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                   (in_stack_fffffffffffffd10,
                    (float *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
              ((SpectrumHandle *)in_stack_fffffffffffffd00,
               (ConstantSpectrum *)in_stack_fffffffffffffcf8);
    SpectrumHandle::operator=
              ((SpectrumHandle *)in_stack_fffffffffffffd00,
               (SpectrumHandle *)in_stack_fffffffffffffcf8);
  }
  __a = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffd40),(char *)in_stack_fffffffffffffd38,__a);
  FVar5 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,0.0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  args_4 = &local_221;
  local_1d8 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffd40),(char *)in_stack_fffffffffffffd38,__a);
  FVar6 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,0.0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  local_200 = FVar6;
  pHVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HomogeneousMedium,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,float&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)CONCAT17(uVar2,in_stack_fffffffffffffd40),
                      in_stack_fffffffffffffd38,(SpectrumHandle *)__a,(float *)local_10,
                      (SpectrumHandle *)CONCAT44(FVar5,in_stack_fffffffffffffd20),(float *)args_4,
                      args_5);
  std::__cxx11::string::~string(local_48);
  return pHVar4;
}

Assistant:

HomogeneousMedium *HomogeneousMedium::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    SpectrumHandle sig_a = nullptr, sig_s = nullptr;
    std::string preset = parameters.GetOneString("preset", "");
    if (!preset.empty()) {
        if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
            Warning(loc, "Material preset \"%s\" not found.", preset);
    }
    if (sig_a == nullptr) {
        sig_a =
            parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::General, alloc);
        if (sig_a == nullptr)
            sig_a = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                  RGB(.0011f, .0024f, .014f));
    }
    if (sig_s == nullptr) {
        sig_s =
            parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::General, alloc);
        if (sig_s == nullptr)
            sig_s = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                  RGB(2.55f, 3.21f, 3.77f));
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::General, alloc);
    if (Le == nullptr)
        Le = alloc.new_object<ConstantSpectrum>(0.f);

    Float sigScale = parameters.GetOneFloat("scale", 1.f);

    Float g = parameters.GetOneFloat("g", 0.0f);

    return alloc.new_object<HomogeneousMedium>(sig_a, sig_s, sigScale, Le, g, alloc);
}